

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marker-index.cc
# Opt level: O0

void __thiscall MarkerIndex::Iterator::Iterator(Iterator *this,MarkerIndex *marker_index)

{
  MarkerIndex *marker_index_local;
  Iterator *this_local;
  
  this->marker_index = marker_index;
  this->current_node = (Node *)0x0;
  Point::Point(&this->current_node_position);
  Point::Point(&this->left_ancestor_position);
  Point::Point(&this->right_ancestor_position);
  std::vector<Point,_std::allocator<Point>_>::vector(&this->left_ancestor_position_stack);
  std::vector<Point,_std::allocator<Point>_>::vector(&this->right_ancestor_position_stack);
  return;
}

Assistant:

MarkerIndex::Iterator::Iterator(MarkerIndex *marker_index) :
  marker_index{marker_index},
  current_node{nullptr} {}